

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::createCompositeConstruct
          (TGlslangToSpvTraverser *this,Id resultTypeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *constituents)

{
  bool bVar1;
  Id IVar2;
  Id typeId;
  size_type sVar3;
  reference pvVar4;
  SpvVersion *pSVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  Id local_a0;
  uint local_9c;
  Id local_98;
  int i_1;
  Id elementRType;
  int numrTypeConstituents_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rTypeConstituents_1;
  Id local_5c;
  uint local_58;
  uint local_54;
  int i;
  int numrTypeConstituents;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rTypeConstituents;
  Id rType;
  Id lType;
  Id *constituent;
  int c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *constituents_local;
  Id resultTypeId_local;
  TGlslangToSpvTraverser *this_local;
  
  constituent._4_4_ = 0;
  do {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(constituents);
    if ((int)sVar3 <= constituent._4_4_) {
      IVar2 = spv::Builder::createCompositeConstruct(&this->builder,resultTypeId,constituents);
      return IVar2;
    }
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (constituents,(long)constituent._4_4_);
    rTypeConstituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         spv::Builder::getContainedTypeId(&this->builder,resultTypeId,constituent._4_4_);
    rTypeConstituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         spv::Builder::getTypeId(&this->builder,*pvVar4);
    if (rTypeConstituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ !=
        (Id)rTypeConstituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
      pSVar5 = glslang::TIntermediate::getSpv(this->glslangIntermediate);
      if (pSVar5->spv < 0x10400) {
        bVar1 = spv::Builder::isStructType
                          (&this->builder,
                           (Id)rTypeConstituents.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
          local_54 = spv::Builder::getNumTypeConstituents
                               (&this->builder,
                                (Id)rTypeConstituents.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          for (local_58 = 0;
              IVar2 = rTypeConstituents.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_, (int)local_58 < (int)local_54
              ; local_58 = local_58 + 1) {
            IVar2 = *pvVar4;
            typeId = spv::Builder::getContainedTypeId
                               (&this->builder,
                                (Id)rTypeConstituents.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,local_58);
            local_5c = spv::Builder::createCompositeExtract(&this->builder,IVar2,typeId,local_58);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&local_5c);
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &rTypeConstituents_1.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
          IVar2 = createCompositeConstruct
                            (this,IVar2,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &rTypeConstituents_1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (constituents,(long)constituent._4_4_);
          *pvVar4 = IVar2;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &rTypeConstituents_1.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
        }
        else {
          bVar1 = spv::Builder::isArrayType
                            (&this->builder,
                             (Id)rTypeConstituents.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (!bVar1) {
            __assert_fail("builder.isArrayType(rType)",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                          ,0xb5d,
                          "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createCompositeConstruct(spv::Id, std::vector<spv::Id>)"
                         );
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&elementRType);
          i_1 = spv::Builder::getNumTypeConstituents
                          (&this->builder,
                           (Id)rTypeConstituents.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          local_98 = spv::Builder::getContainedTypeId
                               (&this->builder,
                                (Id)rTypeConstituents.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          for (local_9c = 0;
              IVar2 = rTypeConstituents.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_, (int)local_9c < i_1;
              local_9c = local_9c + 1) {
            local_a0 = spv::Builder::createCompositeExtract
                                 (&this->builder,*pvVar4,local_98,local_9c);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&elementRType,
                       &local_a0);
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_b8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&elementRType)
          ;
          IVar2 = createCompositeConstruct(this,IVar2,&local_b8);
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (constituents,(long)constituent._4_4_);
          *pvVar4 = IVar2;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_b8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&elementRType);
        }
      }
      else {
        IVar2 = spv::Builder::createUnaryOp
                          (&this->builder,OpCopyLogical,
                           rTypeConstituents.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_,*pvVar4);
        *pvVar4 = IVar2;
      }
    }
    constituent._4_4_ = constituent._4_4_ + 1;
  } while( true );
}

Assistant:

spv::Id TGlslangToSpvTraverser::createCompositeConstruct(spv::Id resultTypeId, std::vector<spv::Id> constituents)
{
    for (int c = 0; c < (int)constituents.size(); ++c) {
        spv::Id& constituent = constituents[c];
        spv::Id lType = builder.getContainedTypeId(resultTypeId, c);
        spv::Id rType = builder.getTypeId(constituent);
        if (lType != rType) {
            if (glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_4) {
                constituent = builder.createUnaryOp(spv::OpCopyLogical, lType, constituent);
            } else if (builder.isStructType(rType)) {
                std::vector<spv::Id> rTypeConstituents;
                int numrTypeConstituents = builder.getNumTypeConstituents(rType);
                for (int i = 0; i < numrTypeConstituents; ++i) {
                    rTypeConstituents.push_back(builder.createCompositeExtract(constituent,
                        builder.getContainedTypeId(rType, i), i));
                }
                constituents[c] = createCompositeConstruct(lType, rTypeConstituents);
            } else {
                assert(builder.isArrayType(rType));
                std::vector<spv::Id> rTypeConstituents;
                int numrTypeConstituents = builder.getNumTypeConstituents(rType);

                spv::Id elementRType = builder.getContainedTypeId(rType);
                for (int i = 0; i < numrTypeConstituents; ++i) {
                    rTypeConstituents.push_back(builder.createCompositeExtract(constituent, elementRType, i));
                }
                constituents[c] = createCompositeConstruct(lType, rTypeConstituents);
            }
        }
    }
    return builder.createCompositeConstruct(resultTypeId, constituents);
}